

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.cpp
# Opt level: O2

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::SuiteTest::result(SuiteTest *this)

{
  _Head_base<0UL,_const_oout::Result_*,_false> _Var1;
  Test TVar2;
  long in_RSI;
  long *plVar3;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  results;
  TimedTest local_a0;
  shared_ptr<const_oout::Test> local_88;
  _Head_base<0UL,_const_oout::Result_*,_false> local_78;
  TimedTest local_70;
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  local_58;
  __shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_58._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_58;
  local_58._M_impl._M_node._M_size = 0;
  plVar3 = (long *)(in_RSI + 8);
  local_78._M_head_impl = (Result *)this;
  local_58._M_impl._M_node.super__List_node_base._M_prev =
       local_58._M_impl._M_node.super__List_node_base._M_next;
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)(in_RSI + 8)) {
    std::make_shared<oout::SafeTest,std::shared_ptr<oout::Test_const>const&>(&local_a0.test);
    local_88.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    TimedTest::TimedTest(&local_70,&local_88);
    TimedTest::result(&local_a0);
    std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
              (local_40,(unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)
                        &local_a0);
    std::__cxx11::
    list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
    ::push_back((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                 *)&local_58,(value_type *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    if (local_a0.super_Test._vptr_Test != (_func_int **)0x0) {
      (**(code **)(*local_a0.super_Test._vptr_Test + 8))();
    }
    local_a0.super_Test._vptr_Test = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_70.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::
  make_unique<oout::SuiteResult,std::__cxx11::list<std::shared_ptr<oout::Result_const>,std::allocator<std::shared_ptr<oout::Result_const>>>&>
            ((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
              *)&local_70);
  TVar2._vptr_Test = local_70.super_Test._vptr_Test;
  _Var1._M_head_impl = local_78._M_head_impl;
  local_70.super_Test._vptr_Test = (_func_int **)0x0;
  (local_78._M_head_impl)->_vptr_Result = TVar2._vptr_Test;
  std::unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_>::~unique_ptr
            ((unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)&local_70);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  ::_M_clear(&local_58);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         _Var1._M_head_impl;
}

Assistant:

unique_ptr<const Result> SuiteTest::result() const
{
	list<shared_ptr<const Result>> results;
	for (const auto &c : cases) {
		results.push_back(TimedTest(make_shared<SafeTest>(c)).result());
	}
	return make_unique<SuiteResult>(results);
}